

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

ErrorCode __thiscall
cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::
operator()(Object<(anonymous_namespace)::ObjectStruct> *this,ObjectStruct *out,Value *value)

{
  pointer pMVar1;
  char *pcVar2;
  bool bVar3;
  ErrorCode EVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  ErrorCode unaff_EBP;
  pointer pMVar5;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  ObjectStruct *local_70;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  
  local_70 = out;
  if (value == (Value *)0x0) {
    if (this->AnyRequired == true) goto LAB_0017a358;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    bVar3 = Json::Value::isObject(value);
    if (!bVar3) {
LAB_0017a358:
      return this->Fail;
    }
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Json::Value::getMemberNames_abi_cxx11_((Members *)&local_48,value);
    local_68._16_8_ =
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._8_8_ =
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68._0_8_ =
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48._M_allocated_capacity;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
    local_48._M_allocated_capacity = 0;
    local_48._8_8_ = (Value *)0x0;
    local_38 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
  }
  pMVar1 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar5 = (this->Members).
                super__Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar1; pMVar5 = pMVar5 + 1) {
    pcVar2 = (pMVar5->Name)._M_str;
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,pcVar2,pcVar2 + (pMVar5->Name)._M_len);
    if ((value == (Value *)0x0) || (bVar3 = Json::Value::isMember(value,(String *)local_68), !bVar3)
       ) {
      if (pMVar5->Required == false) {
        local_48._M_allocated_capacity = 0;
        if ((pMVar5->Function).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        EVar4 = (*(pMVar5->Function)._M_invoker)
                          ((_Any_data *)&pMVar5->Function,local_70,
                           (Value **)&local_48._M_allocated_capacity);
        bVar3 = EVar4 == this->Success;
        if (!bVar3) {
          unaff_EBP = EVar4;
        }
      }
      else {
        bVar3 = false;
        unaff_EBP = this->Fail;
      }
    }
    else {
      local_48._M_allocated_capacity = (size_type)Json::Value::operator[](value,(String *)local_68);
      if ((pMVar5->Function).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      EVar4 = (*(pMVar5->Function)._M_invoker)
                        ((_Any_data *)&pMVar5->Function,local_70,
                         (Value **)&local_48._M_allocated_capacity);
      if (EVar4 == this->Success) {
        __position = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               (local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,(String *)local_68);
        bVar3 = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_88,(iterator)__position._M_current);
      }
      else {
        bVar3 = false;
        unaff_EBP = EVar4;
      }
    }
    if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    if (!bVar3) goto LAB_0017a49b;
  }
  unaff_EBP = (&this->Success)
              [(byte)(local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish & ~this->AllowExtra)];
LAB_0017a49b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return unaff_EBP;
}

Assistant:

E operator()(T& out, const Json::Value* value, CallState&&... state) const
    {
      if (!value && this->AnyRequired) {
        return this->Fail;
      }
      if (value && !value->isObject()) {
        return this->Fail;
      }
      Json::Value::Members extraFields;
      if (value) {
        extraFields = value->getMemberNames();
      }

      for (auto const& m : this->Members) {
        std::string name(m.Name.data(), m.Name.size());
        if (value && value->isMember(name)) {
          E result = m.Function(out, &(*value)[name], std::forward(state)...);
          if (result != this->Success) {
            return result;
          }
          extraFields.erase(
            std::find(extraFields.begin(), extraFields.end(), name));
        } else if (!m.Required) {
          E result = m.Function(out, nullptr, std::forward(state)...);
          if (result != this->Success) {
            return result;
          }
        } else {
          return this->Fail;
        }
      }

      return this->AllowExtra || extraFields.empty() ? this->Success
                                                     : this->Fail;
    }